

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void flat_mask_internal_dual(__m128i *th,__m128i *p,__m128i *q,int start,int end,__m128i *flat)

{
  ushort uVar1;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined1 auVar2 [16];
  ushort uVar9;
  undefined1 auVar10 [16];
  ushort local_2f8;
  ushort uStack_2f6;
  ushort uStack_2f4;
  ushort uStack_2f2;
  ushort uStack_2f0;
  ushort uStack_2ee;
  ushort uStack_2ec;
  ushort uStack_2ea;
  int local_2e4;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  __m128i zero;
  __m128i ft;
  __m128i max;
  int i;
  __m128i *flat_local;
  int end_local;
  int start_local;
  __m128i *q_local;
  __m128i *p_local;
  __m128i *th_local;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  auVar10 = psubusw((undefined1  [16])q[start],(undefined1  [16])*q);
  auVar2 = psubusw((undefined1  [16])*q,(undefined1  [16])q[start]);
  local_198 = auVar10._0_8_;
  uStack_190 = auVar10._8_8_;
  local_1a8 = auVar2._0_8_;
  uStack_1a0 = auVar2._8_8_;
  local_198 = local_198 | local_1a8;
  uStack_190 = uStack_190 | uStack_1a0;
  auVar10 = psubusw((undefined1  [16])p[start],(undefined1  [16])*p);
  auVar2 = psubusw((undefined1  [16])*p,(undefined1  [16])p[start]);
  local_1d8 = auVar10._0_8_;
  uStack_1d0 = auVar10._8_8_;
  local_1e8 = auVar2._0_8_;
  uStack_1e0 = auVar2._8_8_;
  local_1d8 = local_1d8 | local_1e8;
  uStack_1d0 = uStack_1d0 | uStack_1e0;
  local_18 = (short)local_198;
  sStack_16 = (short)(local_198 >> 0x10);
  sStack_14 = (short)(local_198 >> 0x20);
  sStack_12 = (short)(local_198 >> 0x30);
  sStack_10 = (short)uStack_190;
  sStack_e = (short)(uStack_190 >> 0x10);
  sStack_c = (short)(uStack_190 >> 0x20);
  sStack_a = (short)(uStack_190 >> 0x30);
  th_local._0_2_ = (short)local_1d8;
  th_local._2_2_ = (short)(local_1d8 >> 0x10);
  th_local._4_2_ = (short)(local_1d8 >> 0x20);
  th_local._6_2_ = (short)(local_1d8 >> 0x30);
  sStack_20 = (short)uStack_1d0;
  sStack_1e = (short)(uStack_1d0 >> 0x10);
  sStack_1c = (short)(uStack_1d0 >> 0x20);
  sStack_1a = (short)(uStack_1d0 >> 0x30);
  local_2f8 = (ushort)(local_18 < (short)th_local) * (short)th_local |
              (ushort)(local_18 >= (short)th_local) * local_18;
  uStack_2f6 = (ushort)(sStack_16 < th_local._2_2_) * th_local._2_2_ |
               (ushort)(sStack_16 >= th_local._2_2_) * sStack_16;
  uStack_2f4 = (ushort)(sStack_14 < th_local._4_2_) * th_local._4_2_ |
               (ushort)(sStack_14 >= th_local._4_2_) * sStack_14;
  uStack_2f2 = (ushort)(sStack_12 < th_local._6_2_) * th_local._6_2_ |
               (ushort)(sStack_12 >= th_local._6_2_) * sStack_12;
  uStack_2f0 = (ushort)(sStack_10 < sStack_20) * sStack_20 |
               (ushort)(sStack_10 >= sStack_20) * sStack_10;
  uStack_2ee = (ushort)(sStack_e < sStack_1e) * sStack_1e |
               (ushort)(sStack_e >= sStack_1e) * sStack_e;
  uStack_2ec = (ushort)(sStack_c < sStack_1c) * sStack_1c |
               (ushort)(sStack_c >= sStack_1c) * sStack_c;
  uStack_2ea = (ushort)(sStack_a < sStack_1a) * sStack_1a |
               (ushort)(sStack_a >= sStack_1a) * sStack_a;
  for (local_2e4 = start + 1; local_2e4 < end; local_2e4 = local_2e4 + 1) {
    auVar10 = psubusw((undefined1  [16])p[local_2e4],(undefined1  [16])*p);
    auVar2 = psubusw((undefined1  [16])*p,(undefined1  [16])p[local_2e4]);
    local_218 = auVar10._0_8_;
    uStack_210 = auVar10._8_8_;
    local_228 = auVar2._0_8_;
    uStack_220 = auVar2._8_8_;
    local_218 = local_218 | local_228;
    uStack_210 = uStack_210 | uStack_220;
    flat_local._0_2_ = (short)local_218;
    flat_local._2_2_ = (short)(local_218 >> 0x10);
    flat_local._4_2_ = (short)(local_218 >> 0x20);
    flat_local._6_2_ = (short)(local_218 >> 0x30);
    end_local._0_2_ = (short)uStack_210;
    end_local._2_2_ = (short)(uStack_210 >> 0x10);
    start_local._0_2_ = (short)(uStack_210 >> 0x20);
    start_local._2_2_ = (short)(uStack_210 >> 0x30);
    uVar1 = (ushort)((short)local_2f8 < (short)flat_local) * (short)flat_local |
            ((short)local_2f8 >= (short)flat_local) * local_2f8;
    uVar3 = (ushort)((short)uStack_2f6 < flat_local._2_2_) * flat_local._2_2_ |
            ((short)uStack_2f6 >= flat_local._2_2_) * uStack_2f6;
    uVar4 = (ushort)((short)uStack_2f4 < flat_local._4_2_) * flat_local._4_2_ |
            ((short)uStack_2f4 >= flat_local._4_2_) * uStack_2f4;
    uVar5 = (ushort)((short)uStack_2f2 < flat_local._6_2_) * flat_local._6_2_ |
            ((short)uStack_2f2 >= flat_local._6_2_) * uStack_2f2;
    uVar6 = (ushort)((short)uStack_2f0 < (short)end_local) * (short)end_local |
            ((short)uStack_2f0 >= (short)end_local) * uStack_2f0;
    uVar7 = (ushort)((short)uStack_2ee < end_local._2_2_) * end_local._2_2_ |
            ((short)uStack_2ee >= end_local._2_2_) * uStack_2ee;
    uVar8 = (ushort)((short)uStack_2ec < (short)start_local) * (short)start_local |
            ((short)uStack_2ec >= (short)start_local) * uStack_2ec;
    uVar9 = (ushort)((short)uStack_2ea < start_local._2_2_) * start_local._2_2_ |
            ((short)uStack_2ea >= start_local._2_2_) * uStack_2ea;
    auVar10 = psubusw((undefined1  [16])q[local_2e4],(undefined1  [16])*q);
    auVar2 = psubusw((undefined1  [16])*q,(undefined1  [16])q[local_2e4]);
    local_258 = auVar10._0_8_;
    uStack_250 = auVar10._8_8_;
    local_268 = auVar2._0_8_;
    uStack_260 = auVar2._8_8_;
    local_258 = local_258 | local_268;
    uStack_250 = uStack_250 | uStack_260;
    ft[1]._0_2_ = (short)local_258;
    ft[1]._2_2_ = (short)(local_258 >> 0x10);
    ft[1]._4_2_ = (short)(local_258 >> 0x20);
    ft[1]._6_2_ = (short)(local_258 >> 0x30);
    max[0]._0_2_ = (short)uStack_250;
    max[0]._2_2_ = (short)(uStack_250 >> 0x10);
    max[0]._4_2_ = (short)(uStack_250 >> 0x20);
    max[0]._6_2_ = (short)(uStack_250 >> 0x30);
    local_2f8 = (ushort)((short)uVar1 < (short)ft[1]) * (short)ft[1] |
                ((short)uVar1 >= (short)ft[1]) * uVar1;
    uStack_2f6 = (ushort)((short)uVar3 < ft[1]._2_2_) * ft[1]._2_2_ |
                 ((short)uVar3 >= ft[1]._2_2_) * uVar3;
    uStack_2f4 = (ushort)((short)uVar4 < ft[1]._4_2_) * ft[1]._4_2_ |
                 ((short)uVar4 >= ft[1]._4_2_) * uVar4;
    uStack_2f2 = (ushort)((short)uVar5 < ft[1]._6_2_) * ft[1]._6_2_ |
                 ((short)uVar5 >= ft[1]._6_2_) * uVar5;
    uStack_2f0 = (ushort)((short)uVar6 < (short)max[0]) * (short)max[0] |
                 ((short)uVar6 >= (short)max[0]) * uVar6;
    uStack_2ee = (ushort)((short)uVar7 < max[0]._2_2_) * max[0]._2_2_ |
                 ((short)uVar7 >= max[0]._2_2_) * uVar7;
    uStack_2ec = (ushort)((short)uVar8 < max[0]._4_2_) * max[0]._4_2_ |
                 ((short)uVar8 >= max[0]._4_2_) * uVar8;
    uStack_2ea = (ushort)((short)uVar9 < max[0]._6_2_) * max[0]._6_2_ |
                 ((short)uVar9 >= max[0]._6_2_) * uVar9;
  }
  auVar2._2_2_ = uStack_2f6;
  auVar2._0_2_ = local_2f8;
  auVar2._4_2_ = uStack_2f4;
  auVar2._6_2_ = uStack_2f2;
  auVar2._10_2_ = uStack_2ee;
  auVar2._8_2_ = uStack_2f0;
  auVar2._12_2_ = uStack_2ec;
  auVar2._14_2_ = uStack_2ea;
  auVar2 = psubusw(auVar2,(undefined1  [16])*th);
  local_298 = auVar2._0_2_;
  sStack_296 = auVar2._2_2_;
  sStack_294 = auVar2._4_2_;
  sStack_292 = auVar2._6_2_;
  sStack_290 = auVar2._8_2_;
  sStack_28e = auVar2._10_2_;
  sStack_28c = auVar2._12_2_;
  sStack_28a = auVar2._14_2_;
  *(ushort *)*flat = -(ushort)(local_298 == 0);
  *(ushort *)((long)*flat + 2) = -(ushort)(sStack_296 == 0);
  *(ushort *)((long)*flat + 4) = -(ushort)(sStack_294 == 0);
  *(ushort *)((long)*flat + 6) = -(ushort)(sStack_292 == 0);
  *(ushort *)(*flat + 1) = -(ushort)(sStack_290 == 0);
  *(ushort *)((long)*flat + 10) = -(ushort)(sStack_28e == 0);
  *(ushort *)((long)*flat + 0xc) = -(ushort)(sStack_28c == 0);
  *(ushort *)((long)*flat + 0xe) = -(ushort)(sStack_28a == 0);
  return;
}

Assistant:

static inline void flat_mask_internal_dual(const __m128i *th, const __m128i *p,
                                           const __m128i *q, int start, int end,
                                           __m128i *flat) {
  int i;
  __m128i max =
      _mm_max_epi16(abs_diff16(q[start], q[0]), abs_diff16(p[start], p[0]));

  for (i = start + 1; i < end; ++i) {
    max = _mm_max_epi16(max, abs_diff16(p[i], p[0]));
    max = _mm_max_epi16(max, abs_diff16(q[i], q[0]));
  }

  __m128i ft;
  ft = _mm_subs_epu16(max, *th);

  const __m128i zero = _mm_setzero_si128();
  *flat = _mm_cmpeq_epi16(ft, zero);
}